

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.c
# Opt level: O3

int CheckExts(tchar_t *URL,tchar_t *Exts)

{
  int iVar1;
  char *pcVar2;
  size_t n;
  tchar_t Ext [256];
  char local_128 [256];
  
  SplitPath(URL,(tchar_t *)0x0,0,(tchar_t *)0x0,0,local_128,0x100);
  pcVar2 = strchr(local_128,0x3f);
  if (pcVar2 != (char *)0x0) {
    *pcVar2 = '\0';
  }
  n = strlen(local_128);
  if (Exts != (tchar_t *)0x0) {
    do {
      pcVar2 = strchr(Exts,0x3a);
      if ((n == (long)pcVar2 - (long)Exts && pcVar2 != (char *)0x0) &&
         (iVar1 = tcsnicmp(local_128,Exts,n), iVar1 == 0)) {
        return (int)pcVar2[1];
      }
      pcVar2 = strchr(Exts,0x3b);
      Exts = pcVar2 + 1;
    } while (pcVar2 != (char *)0x0);
  }
  return 0;
}

Assistant:

int CheckExts(const tchar_t* URL, const tchar_t* Exts)
{
    tchar_t Ext[MAXPATH];
    tchar_t* Tail;
    intptr_t ExtLen;

    SplitPath(URL,NULL,0,NULL,0,Ext,TSIZEOF(Ext));
    Tail = tcschr(Ext,'?');
    if (Tail) *Tail = 0;
    ExtLen = tcslen(Ext);

    while (Exts)
    {
        const tchar_t* p = tcschr(Exts,':');
        if (p && (ExtLen == p-Exts) && tcsnicmp(Ext,Exts,p-Exts)==0)
            return p[1]; // return type char
        Exts = tcschr(Exts,';');
        if (Exts) ++Exts;
    }
    return 0;
}